

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O0

int xmlC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur,xmlNsPtr ns)

{
  xmlNsPtr pxVar1;
  int iVar2;
  xmlChar *local_80;
  xmlChar *local_70;
  int local_60;
  bool local_59;
  xmlChar *local_58;
  xmlChar *local_50;
  xmlNsPtr ns1;
  int start;
  int has_empty_ns;
  xmlChar *href;
  xmlChar *prefix;
  int i;
  xmlNsPtr ns_local;
  xmlC14NVisibleNsStackPtr cur_local;
  
  if (cur == (xmlC14NVisibleNsStackPtr)0x0) {
    xmlC14NErrParam((xmlC14NCtxPtr)0x0);
    cur_local._4_4_ = 0;
  }
  else {
    if ((ns == (xmlNsPtr)0x0) || (ns->prefix == (xmlChar *)0x0)) {
      local_50 = "";
    }
    else {
      local_50 = ns->prefix;
    }
    if ((ns == (xmlNsPtr)0x0) || (ns->href == (xmlChar *)0x0)) {
      local_58 = "";
    }
    else {
      local_58 = ns->href;
    }
    iVar2 = xmlC14NStrEqual(local_50,(xmlChar *)0x0);
    local_59 = false;
    if (iVar2 != 0) {
      iVar2 = xmlC14NStrEqual(local_58,(xmlChar *)0x0);
      local_59 = iVar2 != 0;
    }
    cur_local._4_4_ = (uint)local_59;
    if (cur->nsTab != (xmlNsPtr *)0x0) {
      if (cur_local._4_4_ == 0) {
        local_60 = cur->nsPrevStart;
      }
      else {
        local_60 = 0;
      }
      prefix._4_4_ = cur->nsCurEnd;
      do {
        prefix._4_4_ = prefix._4_4_ + -1;
        if (prefix._4_4_ < local_60) {
          return cur_local._4_4_;
        }
        pxVar1 = cur->nsTab[prefix._4_4_];
        if (pxVar1 == (xmlNsPtr)0x0) {
          local_70 = (xmlChar *)0x0;
        }
        else {
          local_70 = pxVar1->prefix;
        }
        iVar2 = xmlC14NStrEqual(local_50,local_70);
      } while (iVar2 == 0);
      if (pxVar1 == (xmlNsPtr)0x0) {
        local_80 = (xmlChar *)0x0;
      }
      else {
        local_80 = pxVar1->href;
      }
      cur_local._4_4_ = xmlC14NStrEqual(local_58,local_80);
    }
  }
  return cur_local._4_4_;
}

Assistant:

static int
xmlC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur, xmlNsPtr ns)
{
    int i;
    const xmlChar *prefix;
    const xmlChar *href;
    int has_empty_ns;

    if(cur == NULL) {
        xmlC14NErrParam(NULL);
        return (0);
    }

    /*
     * if the default namespace xmlns="" is not defined yet then
     * we do not want to print it out
     */
    prefix = ((ns == NULL) || (ns->prefix == NULL)) ? BAD_CAST "" : ns->prefix;
    href = ((ns == NULL) || (ns->href == NULL)) ? BAD_CAST "" : ns->href;
    has_empty_ns = (xmlC14NStrEqual(prefix, NULL) && xmlC14NStrEqual(href, NULL));

    if (cur->nsTab != NULL) {
	int start = (has_empty_ns) ? 0 : cur->nsPrevStart;
        for (i = cur->nsCurEnd - 1; i >= start; --i) {
            xmlNsPtr ns1 = cur->nsTab[i];

	    if(xmlC14NStrEqual(prefix, (ns1 != NULL) ? ns1->prefix : NULL)) {
		return(xmlC14NStrEqual(href, (ns1 != NULL) ? ns1->href : NULL));
	    }
        }
    }
    return(has_empty_ns);
}